

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O0

size_t Diligent::ComputeHashRaw(void *pData,size_t Size)

{
  Uint8 *pUVar1;
  Char *pCVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  undefined8 Args_1;
  unsigned_long local_a0;
  uint local_94;
  undefined1 local_90 [8];
  string msg_1;
  undefined1 local_68 [8];
  string msg;
  Uint64 Shift;
  Uint64 Buffer;
  Uint32 *DwordPtr;
  Uint8 *EndPtr;
  Uint8 *BytePtr;
  size_t Hash;
  size_t Size_local;
  void *pData_local;
  
  BytePtr = (Uint8 *)0x0;
  pUVar1 = (Uint8 *)((long)pData + Size);
  Hash = Size;
  Size_local = (size_t)pData;
  Buffer = (Uint64)AlignUp<void_const,unsigned_long>(pData,4);
  Shift = 0;
  msg.field_2._8_8_ = 0;
  for (EndPtr = (Uint8 *)pData; EndPtr < pUVar1 && EndPtr < Buffer; EndPtr = EndPtr + 1) {
    Shift = (ulong)*EndPtr << ((byte)msg.field_2._8_8_ & 0x3f) | Shift;
    msg.field_2._8_8_ = msg.field_2._8_8_ + 8;
  }
  Args_1 = EndPtr;
  if (0x18 < (ulong)msg.field_2._8_8_) {
    FormatString<char[26],char[12]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Shift <= 24",(char (*) [12])EndPtr);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [21])0x9e;
    DebugAssertionFailed
              (pCVar2,"ComputeHashRaw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0x9e);
    std::__cxx11::string::~string((string *)local_68);
  }
  while ((Uint8 *)(Buffer + 4) <= pUVar1) {
    uVar3 = (ulong)*(uint *)Buffer << ((byte)msg.field_2._8_8_ & 0x3f) | Shift;
    msg_1.field_2._12_4_ = (undefined4)uVar3;
    Args_1 = msg.field_2._8_8_;
    HashCombine<unsigned_int>((size_t *)&BytePtr,(uint *)(msg_1.field_2._M_local_buf + 0xc));
    Shift = uVar3 >> 0x20;
    Buffer = Buffer + 4;
  }
  for (EndPtr = (Uint8 *)Buffer; EndPtr < pUVar1; EndPtr = EndPtr + 1) {
    Shift = (ulong)*EndPtr << ((byte)msg.field_2._8_8_ & 0x3f) | Shift;
    Args_1 = msg.field_2._8_8_;
    msg.field_2._8_8_ = msg.field_2._8_8_ + 8;
  }
  if (0x30 < (ulong)msg.field_2._8_8_) {
    FormatString<char[26],char[21]>
              ((string *)local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Shift <= (3 + 3) * 8",(char (*) [21])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ComputeHashRaw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xaf);
    std::__cxx11::string::~string((string *)local_90);
  }
  for (; msg.field_2._8_8_ != 0; msg.field_2._8_8_ = msg.field_2._8_8_ - *puVar4) {
    local_94 = (uint)Shift;
    HashCombine<unsigned_int>((size_t *)&BytePtr,&local_94);
    Shift = Shift >> 0x20;
    local_a0 = 0x20;
    puVar4 = std::min<unsigned_long>((unsigned_long *)(msg.field_2._M_local_buf + 8),&local_a0);
  }
  return (size_t)BytePtr;
}

Assistant:

inline std::size_t ComputeHashRaw(const void* pData, size_t Size) noexcept
{
    size_t Hash = 0;

    const auto* BytePtr  = static_cast<const Uint8*>(pData);
    const auto* EndPtr   = BytePtr + Size;
    const auto* DwordPtr = static_cast<const Uint32*>(AlignUp(pData, alignof(Uint32)));

    // Process initial bytes before we get to the 32-bit aligned pointer
    Uint64 Buffer = 0;
    Uint64 Shift  = 0;
    while (BytePtr < EndPtr && BytePtr < reinterpret_cast<const Uint8*>(DwordPtr))
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= 24);

    // Process dwords
    while (DwordPtr + 1 <= reinterpret_cast<const Uint32*>(EndPtr))
    {
        Buffer |= Uint64{*(DwordPtr++)} << Shift;
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
    }

    // Process the remaining bytes
    BytePtr = reinterpret_cast<const Uint8*>(DwordPtr);
    while (BytePtr < EndPtr)
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= (3 + 3) * 8);

    while (Shift != 0)
    {
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
        Shift -= (std::min)(Shift, Uint64{32});
    }

    return Hash;
}